

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O2

bool __thiscall Js::BigUInt::FResize(BigUInt *this,int32 clu)

{
  uint32 *src;
  uint uVar1;
  uint32 *dst;
  
  AssertValid(this,false);
  if (clu <= this->m_cluMax) {
    return true;
  }
  uVar1 = clu * 2;
  src = this->m_prglu;
  if (src == this->m_rgluInit) {
    if (uVar1 < 0x20000000) {
      dst = (uint32 *)malloc((ulong)(uint)(clu << 3));
      if (dst != (uint32 *)0x0) {
        if (0 < (long)this->m_clu) {
          js_memcpy_s(dst,(ulong)(uint)(clu << 3),src,(long)this->m_clu << 2);
        }
        goto LAB_00608ee1;
      }
    }
  }
  else {
    dst = (uint32 *)realloc(src,(long)(int)uVar1 << 2);
    if (dst != (uint32 *)0x0) {
LAB_00608ee1:
      this->m_prglu = dst;
      this->m_cluMax = uVar1;
      AssertValid(this,false);
      return true;
    }
  }
  return false;
}

Assistant:

bool BigUInt::FResize(int32 clu)
    {
        AssertBiNoVal(this);

        uint32 *prglu;

        if (clu <= m_cluMax)
            return true;

        clu += clu;
        if (m_prglu == m_rgluInit)
        {
            if ((INT_MAX / sizeof(uint32) < clu) || (NULL == (prglu = (uint32 *)malloc(clu * sizeof(uint32)))))
                return false;
            if (0 < m_clu)
                js_memcpy_s(prglu, clu * sizeof(uint32), m_prglu, m_clu * sizeof(uint32));
        }
        else if (NULL == (prglu = (uint32 *)realloc(m_prglu, clu * sizeof(uint32))))
            return false;

        m_prglu = prglu;
        m_cluMax = clu;

        AssertBiNoVal(this);
        return true;
    }